

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack4.h
# Opt level: O0

void ncnn::deconvolution_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  int iVar78;
  int iVar79;
  undefined8 *puVar80;
  long lVar81;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  int local_2638;
  int local_262c;
  int local_25dc;
  long local_2590;
  undefined8 local_2588;
  undefined8 uStack_2580;
  int local_2574;
  int local_2570;
  undefined8 *local_2500;
  int local_24f4;
  undefined1 local_20e8 [8];
  undefined8 uStack_20e0;
  ulong uStack_2080;
  float local_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float local_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float local_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  float local_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float local_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float local_1ea8;
  float fStack_1ea4;
  float fStack_1ea0;
  float fStack_1e9c;
  float local_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  ulong uStack_1d50;
  float local_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc0;
  float fStack_1cbc;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  float local_1c28;
  float fStack_1c24;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  float local_f48;
  float fStack_f44;
  float fStack_f40;
  float fStack_f3c;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  ulong uStack_780;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  
  lVar74 = in_RSI[7];
  lVar5 = *in_RCX;
  for (local_24f4 = 0; local_24f4 < (int)lVar74; local_24f4 = local_24f4 + 1) {
    local_2500 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_24f4 * in_RSI[2]);
    iVar3 = *(int *)((long)in_RDI + 0x2c);
    lVar75 = in_RDI[6];
    lVar76 = in_RDI[7];
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar77 = in_RSI[6];
    for (local_2570 = 0; local_2570 < (int)lVar77; local_2570 = local_2570 + 1) {
      for (local_2574 = 0; local_2574 < iVar4; local_2574 = local_2574 + 1) {
        local_2588 = 0;
        uStack_2580 = 0;
        if (lVar5 != 0) {
          puVar80 = (undefined8 *)(lVar5 + (long)(local_24f4 << 2) * 4);
          local_2588 = *puVar80;
          uStack_2580 = puVar80[1];
        }
        local_2590 = *in_RDX + in_RDX[8] * (long)local_24f4 * in_RDX[2];
        for (local_25dc = 0; local_25dc < (int)lVar76; local_25dc = local_25dc + 1) {
          for (local_262c = 0; local_262c < in_R9D; local_262c = local_262c + 1) {
            iVar78 = (local_2570 + local_262c * in_stack_00000010) -
                     in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar78) && (iVar78 % in_stack_00000020 == 0)) &&
               (iVar78 / in_stack_00000020 < (int)lVar75)) {
              for (local_2638 = 0; local_2638 < in_R8D; local_2638 = local_2638 + 1) {
                iVar79 = (local_2574 + local_2638 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar79) && (iVar79 % in_stack_00000018 == 0)) &&
                   (iVar79 / in_stack_00000018 < iVar3)) {
                  pfVar1 = (float *)(*in_RDI + in_RDI[8] * (long)local_25dc * in_RDI[2] +
                                     (long)*(int *)((long)in_RDI + 0x2c) *
                                     (long)(iVar78 / in_stack_00000020) * in_RDI[2] +
                                    (long)(iVar79 / in_stack_00000018 << 2) * 4);
                  iVar79 = (local_262c * in_R8D + local_2638) * 0x10;
                  fVar82 = *pfVar1;
                  fVar83 = pfVar1[1];
                  fVar84 = pfVar1[2];
                  fVar85 = pfVar1[3];
                  puVar80 = (undefined8 *)(local_2590 + (long)iVar79 * 4);
                  uVar10 = *puVar80;
                  uVar11 = puVar80[1];
                  lVar81 = local_2590 + (long)iVar79 * 4;
                  uVar12 = *(undefined8 *)(lVar81 + 0x10);
                  uVar13 = *(undefined8 *)(lVar81 + 0x18);
                  lVar81 = local_2590 + (long)iVar79 * 4;
                  uVar14 = *(undefined8 *)(lVar81 + 0x20);
                  uVar15 = *(undefined8 *)(lVar81 + 0x28);
                  lVar81 = local_2590 + (long)iVar79 * 4;
                  uVar16 = *(undefined8 *)(lVar81 + 0x30);
                  uVar17 = *(undefined8 *)(lVar81 + 0x38);
                  local_1fd8 = (float)uVar10;
                  fStack_1fd4 = (float)((ulong)uVar10 >> 0x20);
                  fStack_1fd0 = (float)uVar11;
                  fStack_1fcc = (float)((ulong)uVar11 >> 0x20);
                  local_2058 = (float)local_2588;
                  fStack_2054 = (float)((ulong)local_2588 >> 0x20);
                  fStack_2050 = (float)uStack_2580;
                  fStack_204c = (float)((ulong)uStack_2580 >> 0x20);
                  local_1fb8 = (float)uVar12;
                  fStack_1fb4 = (float)((ulong)uVar12 >> 0x20);
                  fStack_1fb0 = (float)uVar13;
                  fStack_1fac = (float)((ulong)uVar13 >> 0x20);
                  local_1f98 = (float)uVar14;
                  fStack_1f94 = (float)((ulong)uVar14 >> 0x20);
                  fStack_1f90 = (float)uVar15;
                  fStack_1f8c = (float)((ulong)uVar15 >> 0x20);
                  local_1f78 = (float)uVar16;
                  fStack_1f74 = (float)((ulong)uVar16 >> 0x20);
                  fStack_1f70 = (float)uVar17;
                  fStack_1f6c = (float)((ulong)uVar17 >> 0x20);
                  local_2588 = CONCAT44(fVar85 * fStack_1f74 +
                                        fVar84 * fStack_1f94 +
                                        fVar83 * fStack_1fb4 + fVar82 * fStack_1fd4 + fStack_2054,
                                        fVar85 * local_1f78 +
                                        fVar84 * local_1f98 +
                                        fVar83 * local_1fb8 + fVar82 * local_1fd8 + local_2058);
                  uStack_2580 = CONCAT44(fVar85 * fStack_1f6c +
                                         fVar84 * fStack_1f8c +
                                         fVar83 * fStack_1fac + fVar82 * fStack_1fcc + fStack_204c,
                                         fVar85 * fStack_1f70 +
                                         fVar84 * fStack_1f90 +
                                         fVar83 * fStack_1fb0 + fVar82 * fStack_1fd0 + fStack_2050);
                }
              }
            }
          }
          local_2590 = local_2590 + (long)(in_R8D * in_R9D * 0x10) * 4;
        }
        fStack_1cc0 = (float)uStack_2580;
        fStack_1cbc = (float)((ulong)uStack_2580 >> 0x20);
        local_1c28 = (float)local_2588;
        fStack_1c24 = (float)((ulong)local_2588 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          uStack_2080 = SUB168(ZEXT816(0),4);
          auVar18._8_8_ = uStack_2580;
          auVar18._0_8_ = local_2588;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uStack_2080;
          _local_20e8 = vmaxps_avx(auVar18,auVar70 << 0x40);
          break;
        case 2:
          fVar82 = *(float *)*in_stack_00000030;
          auVar21._8_8_ = uStack_2580;
          auVar21._0_8_ = local_2588;
          auVar8 = vmaxps_avx(ZEXT816(0),auVar21);
          auVar22._8_8_ = uStack_2580;
          auVar22._0_8_ = local_2588;
          auVar6 = vminps_avx(ZEXT816(0),auVar22);
          local_1e98 = auVar6._0_4_;
          fStack_1e94 = auVar6._4_4_;
          fStack_1e90 = auVar6._8_4_;
          fStack_1e8c = auVar6._12_4_;
          local_1ea8 = auVar8._0_4_;
          fStack_1ea4 = auVar8._4_4_;
          fStack_1ea0 = auVar8._8_4_;
          fStack_1e9c = auVar8._12_4_;
          local_20e8._4_4_ = fStack_1ea4 + fVar82 * fStack_1e94;
          local_20e8._0_4_ = local_1ea8 + fVar82 * local_1e98;
          uStack_20e0._0_4_ = fStack_1ea0 + fVar82 * fStack_1e90;
          uStack_20e0._4_4_ = fStack_1e9c + fVar82 * fStack_1e8c;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000030;
          auVar19._4_4_ = uVar2;
          auVar19._0_4_ = uVar2;
          auVar19._12_4_ = uVar2;
          auVar19._8_4_ = uVar2;
          uVar2 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar23._4_4_ = uVar2;
          auVar23._0_4_ = uVar2;
          auVar23._12_4_ = uVar2;
          auVar23._8_4_ = uVar2;
          auVar20._8_8_ = uStack_2580;
          auVar20._0_8_ = local_2588;
          auVar8 = vmaxps_avx(auVar20,auVar19);
          _local_20e8 = vminps_avx(auVar8,auVar23);
          break;
        case 4:
          auVar24._8_8_ = 0x3f8000003f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          uStack_1d50 = SUB168(ZEXT816(0),4);
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uStack_1d50;
          auVar33._8_8_ = uStack_2580;
          auVar33._0_8_ = local_2588;
          auVar8 = vsubps_avx(auVar71 << 0x40,auVar33);
          auVar32._8_8_ = 0x42b0c0a542b0c0a5;
          auVar32._0_8_ = 0x42b0c0a542b0c0a5;
          auVar8 = vminps_avx(auVar8,auVar32);
          auVar31._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar7 = vmaxps_avx(auVar8,auVar31);
          local_1318 = auVar7._0_4_;
          fStack_1314 = auVar7._4_4_;
          fStack_1310 = auVar7._8_4_;
          fStack_130c = auVar7._12_4_;
          fVar82 = local_1318 * 1.442695 + 0.5;
          fVar83 = fStack_1314 * 1.442695 + 0.5;
          fVar84 = fStack_1310 * 1.442695 + 0.5;
          fVar85 = fStack_130c * 1.442695 + 0.5;
          local_16c8 = CONCAT44(fVar83,fVar82);
          uStack_16c0._0_4_ = fVar84;
          uStack_16c0._4_4_ = fVar85;
          local_16d8 = CONCAT44((int)fVar83,(int)fVar82);
          uStack_16d0._0_4_ = (int)fVar84;
          uStack_16d0._4_4_ = (int)fVar85;
          auVar34._8_8_ = uStack_16d0;
          auVar34._0_8_ = local_16d8;
          auVar6 = vcvtdq2ps_avx(auVar34);
          auVar36._8_8_ = uStack_16c0;
          auVar36._0_8_ = local_16c8;
          auVar8 = vcmpps_avx(auVar36,auVar6,1);
          auVar38._8_8_ = 0x3f8000003f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar8 = vpand_avx(auVar8,auVar38);
          auVar8 = vsubps_avx(auVar6,auVar8);
          local_10d8 = auVar8._0_4_;
          fStack_10d4 = auVar8._4_4_;
          fStack_10d0 = auVar8._8_4_;
          fStack_10cc = auVar8._12_4_;
          auVar41._4_4_ = fStack_10d4 * 0.6933594;
          auVar41._0_4_ = local_10d8 * 0.6933594;
          auVar41._8_4_ = fStack_10d0 * 0.6933594;
          auVar41._12_4_ = fStack_10cc * 0.6933594;
          auVar8 = vsubps_avx(auVar7,auVar41);
          auVar40._4_4_ = fStack_10d4 * -0.00021219444;
          auVar40._0_4_ = local_10d8 * -0.00021219444;
          auVar40._8_4_ = fStack_10d0 * -0.00021219444;
          auVar40._12_4_ = fStack_10cc * -0.00021219444;
          auVar8 = vsubps_avx(auVar8,auVar40);
          local_1338 = auVar8._0_4_;
          fStack_1334 = auVar8._4_4_;
          fStack_1330 = auVar8._8_4_;
          fStack_132c = auVar8._12_4_;
          local_16d8 = CONCAT44((int)fStack_10d4,(int)local_10d8);
          uStack_16d0._0_4_ = (int)fStack_10d0;
          uStack_16d0._4_4_ = (int)fStack_10cc;
          auVar30._8_8_ = uStack_16d0;
          auVar30._0_8_ = local_16d8;
          auVar29._8_8_ = 0x7f0000007f;
          auVar29._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar30,auVar29);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_1368 = auVar8._0_4_;
          fStack_1364 = auVar8._4_4_;
          fStack_1360 = auVar8._8_4_;
          fStack_135c = auVar8._12_4_;
          auVar25._4_4_ =
               ((((((fStack_1334 * 0.00019875691 + 0.0013981999) * fStack_1334 + 0.008333452) *
                   fStack_1334 + 0.041665796) * fStack_1334 + 0.16666666) * fStack_1334 + 0.5) *
                fStack_1334 * fStack_1334 + fStack_1334 + 1.0) * fStack_1364 + 1.0;
          auVar25._0_4_ =
               ((((((local_1338 * 0.00019875691 + 0.0013981999) * local_1338 + 0.008333452) *
                   local_1338 + 0.041665796) * local_1338 + 0.16666666) * local_1338 + 0.5) *
                local_1338 * local_1338 + local_1338 + 1.0) * local_1368 + 1.0;
          auVar25._8_4_ =
               ((((((fStack_1330 * 0.00019875691 + 0.0013981999) * fStack_1330 + 0.008333452) *
                   fStack_1330 + 0.041665796) * fStack_1330 + 0.16666666) * fStack_1330 + 0.5) *
                fStack_1330 * fStack_1330 + fStack_1330 + 1.0) * fStack_1360 + 1.0;
          auVar25._12_4_ =
               ((((((fStack_132c * 0.00019875691 + 0.0013981999) * fStack_132c + 0.008333452) *
                   fStack_132c + 0.041665796) * fStack_132c + 0.16666666) * fStack_132c + 0.5) *
                fStack_132c * fStack_132c + fStack_132c + 1.0) * fStack_135c + 1.0;
          _local_20e8 = vdivps_avx(auVar24,auVar25);
          break;
        case 5:
          auVar28._8_8_ = uStack_2580;
          auVar28._0_8_ = local_2588;
          auVar27._8_8_ = 0x42b0c0a542b0c0a5;
          auVar27._0_8_ = 0x42b0c0a542b0c0a5;
          auVar8 = vminps_avx(auVar28,auVar27);
          auVar26._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar7 = vmaxps_avx(auVar8,auVar26);
          local_1768 = auVar7._0_4_;
          fStack_1764 = auVar7._4_4_;
          fStack_1760 = auVar7._8_4_;
          fStack_175c = auVar7._12_4_;
          fVar82 = local_1768 * 1.442695 + 0.5;
          fVar83 = fStack_1764 * 1.442695 + 0.5;
          fVar84 = fStack_1760 * 1.442695 + 0.5;
          fVar85 = fStack_175c * 1.442695 + 0.5;
          local_1b18 = CONCAT44(fVar83,fVar82);
          uStack_1b10._0_4_ = fVar84;
          uStack_1b10._4_4_ = fVar85;
          local_1b28 = CONCAT44((int)fVar83,(int)fVar82);
          uStack_1b20._0_4_ = (int)fVar84;
          uStack_1b20._4_4_ = (int)fVar85;
          auVar35._8_8_ = uStack_1b20;
          auVar35._0_8_ = local_1b28;
          auVar6 = vcvtdq2ps_avx(auVar35);
          auVar37._8_8_ = uStack_1b10;
          auVar37._0_8_ = local_1b18;
          auVar8 = vcmpps_avx(auVar37,auVar6,1);
          auVar39._8_8_ = 0x3f8000003f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar8 = vpand_avx(auVar8,auVar39);
          auVar8 = vsubps_avx(auVar6,auVar8);
          local_ff8 = auVar8._0_4_;
          fStack_ff4 = auVar8._4_4_;
          fStack_ff0 = auVar8._8_4_;
          fStack_fec = auVar8._12_4_;
          auVar43._4_4_ = fStack_ff4 * 0.6933594;
          auVar43._0_4_ = local_ff8 * 0.6933594;
          auVar43._8_4_ = fStack_ff0 * 0.6933594;
          auVar43._12_4_ = fStack_fec * 0.6933594;
          auVar8 = vsubps_avx(auVar7,auVar43);
          auVar42._4_4_ = fStack_ff4 * -0.00021219444;
          auVar42._0_4_ = local_ff8 * -0.00021219444;
          auVar42._8_4_ = fStack_ff0 * -0.00021219444;
          auVar42._12_4_ = fStack_fec * -0.00021219444;
          auVar8 = vsubps_avx(auVar8,auVar42);
          local_1788 = auVar8._0_4_;
          fStack_1784 = auVar8._4_4_;
          fStack_1780 = auVar8._8_4_;
          fStack_177c = auVar8._12_4_;
          local_1b28 = CONCAT44((int)fStack_ff4,(int)local_ff8);
          uStack_1b20._0_4_ = (int)fStack_ff0;
          uStack_1b20._4_4_ = (int)fStack_fec;
          auVar9._8_8_ = uStack_1b20;
          auVar9._0_8_ = local_1b28;
          auVar7._8_8_ = 0x7f0000007f;
          auVar7._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar9,auVar7);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_17b8 = auVar8._0_4_;
          fStack_17b4 = auVar8._4_4_;
          fStack_17b0 = auVar8._8_4_;
          fStack_17ac = auVar8._12_4_;
          local_7d8 = CONCAT44(((((((fStack_1784 * 0.00019875691 + 0.0013981999) * fStack_1784 +
                                   0.008333452) * fStack_1784 + 0.041665796) * fStack_1784 +
                                 0.16666666) * fStack_1784 + 0.5) * fStack_1784 * fStack_1784 +
                                fStack_1784 + 1.0) * fStack_17b4 + 1.0,
                               ((((((local_1788 * 0.00019875691 + 0.0013981999) * local_1788 +
                                   0.008333452) * local_1788 + 0.041665796) * local_1788 +
                                 0.16666666) * local_1788 + 0.5) * local_1788 * local_1788 +
                                local_1788 + 1.0) * local_17b8 + 1.0);
          uStack_7d0._0_4_ =
               ((((((fStack_1780 * 0.00019875691 + 0.0013981999) * fStack_1780 + 0.008333452) *
                   fStack_1780 + 0.041665796) * fStack_1780 + 0.16666666) * fStack_1780 + 0.5) *
                fStack_1780 * fStack_1780 + fStack_1780 + 1.0) * fStack_17b0 + 1.0;
          uStack_7d0._4_4_ =
               ((((((fStack_177c * 0.00019875691 + 0.0013981999) * fStack_177c + 0.008333452) *
                   fStack_177c + 0.041665796) * fStack_177c + 0.16666666) * fStack_177c + 0.5) *
                fStack_177c * fStack_177c + fStack_177c + 1.0) * fStack_17ac + 1.0;
          uStack_780 = SUB168(ZEXT816(0),4);
          auVar66._8_8_ = uStack_7d0;
          auVar66._0_8_ = local_7d8;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = uStack_780;
          auVar8 = vcmpps_avx(auVar66,auVar72 << 0x40,2);
          auVar59._8_8_ = uStack_7d0;
          auVar59._0_8_ = local_7d8;
          auVar58._8_8_ = 0x80000000800000;
          auVar58._0_8_ = 0x80000000800000;
          auVar6 = vmaxps_avx(auVar59,auVar58);
          auVar7 = vpsrld_avx(auVar6,ZEXT416(0x17));
          auVar63._8_8_ = 0x807fffff807fffff;
          auVar63._0_8_ = 0x807fffff807fffff;
          auVar6 = vpand_avx(auVar6,auVar63);
          auVar68._8_8_ = 0x3f0000003f000000;
          auVar68._0_8_ = 0x3f0000003f000000;
          auVar9 = vpor_avx(auVar6,auVar68);
          auVar57._8_8_ = 0x7f0000007f;
          auVar57._0_8_ = 0x7f0000007f;
          auVar6 = vpsubd_avx(auVar7,auVar57);
          auVar6 = vcvtdq2ps_avx(auVar6);
          local_408 = auVar6._0_4_;
          fStack_404 = auVar6._4_4_;
          fStack_400 = auVar6._8_4_;
          fStack_3fc = auVar6._12_4_;
          local_818 = CONCAT44(fStack_404 + 1.0,local_408 + 1.0);
          uStack_810._0_4_ = fStack_400 + 1.0;
          uStack_810._4_4_ = fStack_3fc + 1.0;
          auVar69._8_8_ = 0x3f3504f33f3504f3;
          auVar69._0_8_ = 0x3f3504f33f3504f3;
          auVar6 = vcmpps_avx(auVar9,auVar69,1);
          auVar7 = vpand_avx(auVar9,auVar6);
          auVar61._8_8_ = 0x3f8000003f800000;
          auVar61._0_8_ = 0x3f8000003f800000;
          auVar9 = vsubps_avx(auVar9,auVar61);
          auVar62._8_8_ = 0x3f8000003f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar6 = vpand_avx(auVar62,auVar6);
          auVar60._8_8_ = uStack_810;
          auVar60._0_8_ = local_818;
          auVar6 = vsubps_avx(auVar60,auVar6);
          local_428 = auVar9._0_4_;
          fStack_424 = auVar9._4_4_;
          fStack_420 = auVar9._8_4_;
          fStack_41c = auVar9._12_4_;
          local_438 = auVar7._0_4_;
          fStack_434 = auVar7._4_4_;
          fStack_430 = auVar7._8_4_;
          fStack_42c = auVar7._12_4_;
          local_428 = local_428 + local_438;
          fStack_424 = fStack_424 + fStack_434;
          fStack_420 = fStack_420 + fStack_430;
          fStack_41c = fStack_41c + fStack_42c;
          local_2e8 = auVar6._0_4_;
          fStack_2e4 = auVar6._4_4_;
          fStack_2e0 = auVar6._8_4_;
          fStack_2dc = auVar6._12_4_;
          local_858 = CONCAT44(fStack_2e4 * -0.00021219444 +
                               ((((((((fStack_424 * 0.070376836 + -0.1151461) * fStack_424 +
                                     0.116769984) * fStack_424 + -0.12420141) * fStack_424 +
                                   0.14249323) * fStack_424 + -0.16668057) * fStack_424 + 0.20000714
                                 ) * fStack_424 + -0.24999994) * fStack_424 + 0.3333333) *
                               fStack_424 * fStack_424 * fStack_424,
                               local_2e8 * -0.00021219444 +
                               ((((((((local_428 * 0.070376836 + -0.1151461) * local_428 +
                                     0.116769984) * local_428 + -0.12420141) * local_428 +
                                   0.14249323) * local_428 + -0.16668057) * local_428 + 0.20000714)
                                 * local_428 + -0.24999994) * local_428 + 0.3333333) * local_428 *
                               local_428 * local_428);
          uStack_850._0_4_ =
               fStack_2e0 * -0.00021219444 +
               ((((((((fStack_420 * 0.070376836 + -0.1151461) * fStack_420 + 0.116769984) *
                     fStack_420 + -0.12420141) * fStack_420 + 0.14249323) * fStack_420 + -0.16668057
                  ) * fStack_420 + 0.20000714) * fStack_420 + -0.24999994) * fStack_420 + 0.3333333)
               * fStack_420 * fStack_420 * fStack_420;
          uStack_850._4_4_ =
               fStack_2dc * -0.00021219444 +
               ((((((((fStack_41c * 0.070376836 + -0.1151461) * fStack_41c + 0.116769984) *
                     fStack_41c + -0.12420141) * fStack_41c + 0.14249323) * fStack_41c + -0.16668057
                  ) * fStack_41c + 0.20000714) * fStack_41c + -0.24999994) * fStack_41c + 0.3333333)
               * fStack_41c * fStack_41c * fStack_41c;
          auVar65._8_8_ = uStack_850;
          auVar65._0_8_ = local_858;
          auVar64._4_4_ = fStack_424 * fStack_424 * 0.5;
          auVar64._0_4_ = local_428 * local_428 * 0.5;
          auVar64._8_4_ = fStack_420 * fStack_420 * 0.5;
          auVar64._12_4_ = fStack_41c * fStack_41c * 0.5;
          auVar6 = vsubps_avx(auVar65,auVar64);
          local_458 = auVar6._0_4_;
          fStack_454 = auVar6._4_4_;
          fStack_450 = auVar6._8_4_;
          fStack_44c = auVar6._12_4_;
          local_7d8 = CONCAT44(fStack_2e4 * 0.6933594 + fStack_424 + fStack_454,
                               local_2e8 * 0.6933594 + local_428 + local_458);
          uStack_7d0._0_4_ = fStack_2e0 * 0.6933594 + fStack_420 + fStack_450;
          uStack_7d0._4_4_ = fStack_2dc * 0.6933594 + fStack_41c + fStack_44c;
          auVar67._8_8_ = uStack_7d0;
          auVar67._0_8_ = local_7d8;
          auVar8 = vpor_avx(auVar67,auVar8);
          local_f48 = auVar8._0_4_;
          fStack_f44 = auVar8._4_4_;
          fStack_f40 = auVar8._8_4_;
          fStack_f3c = auVar8._12_4_;
          auVar50._4_4_ = fStack_f44 * 2.0;
          auVar50._0_4_ = local_f48 * 2.0;
          auVar50._12_4_ = fStack_f3c * 2.0;
          auVar50._8_4_ = fStack_f40 * 2.0;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = uStack_780;
          auVar8 = vsubps_avx(auVar73 << 0x40,auVar50);
          auVar49._8_8_ = 0x42b0c0a542b0c0a5;
          auVar49._0_8_ = 0x42b0c0a542b0c0a5;
          auVar8 = vminps_avx(auVar8,auVar49);
          auVar48._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar48._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar7 = vmaxps_avx(auVar8,auVar48);
          local_a68 = auVar7._0_4_;
          fStack_a64 = auVar7._4_4_;
          fStack_a60 = auVar7._8_4_;
          fStack_a5c = auVar7._12_4_;
          fVar82 = local_a68 * 1.442695 + 0.5;
          fVar83 = fStack_a64 * 1.442695 + 0.5;
          fVar84 = fStack_a60 * 1.442695 + 0.5;
          fVar85 = fStack_a5c * 1.442695 + 0.5;
          local_e18 = CONCAT44(fVar83,fVar82);
          uStack_e10._0_4_ = fVar84;
          uStack_e10._4_4_ = fVar85;
          local_e28 = CONCAT44((int)fVar83,(int)fVar82);
          uStack_e20._0_4_ = (int)fVar84;
          uStack_e20._4_4_ = (int)fVar85;
          auVar52._8_8_ = uStack_e20;
          auVar52._0_8_ = local_e28;
          auVar6 = vcvtdq2ps_avx(auVar52);
          auVar53._8_8_ = uStack_e10;
          auVar53._0_8_ = local_e18;
          auVar8 = vcmpps_avx(auVar53,auVar6,1);
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar8 = vpand_avx(auVar8,auVar54);
          auVar8 = vsubps_avx(auVar6,auVar8);
          local_898 = auVar8._0_4_;
          fStack_894 = auVar8._4_4_;
          fStack_890 = auVar8._8_4_;
          fStack_88c = auVar8._12_4_;
          auVar56._4_4_ = fStack_894 * 0.6933594;
          auVar56._0_4_ = local_898 * 0.6933594;
          auVar56._8_4_ = fStack_890 * 0.6933594;
          auVar56._12_4_ = fStack_88c * 0.6933594;
          auVar8 = vsubps_avx(auVar7,auVar56);
          auVar55._4_4_ = fStack_894 * -0.00021219444;
          auVar55._0_4_ = local_898 * -0.00021219444;
          auVar55._8_4_ = fStack_890 * -0.00021219444;
          auVar55._12_4_ = fStack_88c * -0.00021219444;
          auVar8 = vsubps_avx(auVar8,auVar55);
          local_a88 = auVar8._0_4_;
          fStack_a84 = auVar8._4_4_;
          fStack_a80 = auVar8._8_4_;
          fStack_a7c = auVar8._12_4_;
          local_e28 = CONCAT44((int)fStack_894,(int)local_898);
          uStack_e20._0_4_ = (int)fStack_890;
          uStack_e20._4_4_ = (int)fStack_88c;
          auVar47._8_8_ = uStack_e20;
          auVar47._0_8_ = local_e28;
          auVar46._8_8_ = 0x7f0000007f;
          auVar46._0_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx(auVar47,auVar46);
          auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
          local_ab8 = auVar8._0_4_;
          fStack_ab4 = auVar8._4_4_;
          fStack_ab0 = auVar8._8_4_;
          fStack_aac = auVar8._12_4_;
          auVar45._8_8_ = 0x3f8000003f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar44._4_4_ =
               (((((fStack_a84 * (fStack_a84 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_a84 + 0.041665796) * fStack_a84 + 0.16666666) * fStack_a84 + 0.5) *
                fStack_a84 * fStack_a84 + fStack_a84 + 1.0) * fStack_ab4 + 1.0;
          auVar44._0_4_ =
               (((((local_a88 * (local_a88 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   local_a88 + 0.041665796) * local_a88 + 0.16666666) * local_a88 + 0.5) *
                local_a88 * local_a88 + local_a88 + 1.0) * local_ab8 + 1.0;
          auVar44._8_4_ =
               (((((fStack_a80 * (fStack_a80 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_a80 + 0.041665796) * fStack_a80 + 0.16666666) * fStack_a80 + 0.5) *
                fStack_a80 * fStack_a80 + fStack_a80 + 1.0) * fStack_ab0 + 1.0;
          auVar44._12_4_ =
               (((((fStack_a7c * (fStack_a7c * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_a7c + 0.041665796) * fStack_a7c + 0.16666666) * fStack_a7c + 0.5) *
                fStack_a7c * fStack_a7c + fStack_a7c + 1.0) * fStack_aac + 1.0;
          auVar8 = vdivps_avx(auVar45,auVar44);
          local_f68 = auVar8._0_4_;
          fStack_f64 = auVar8._4_4_;
          fStack_f60 = auVar8._8_4_;
          fStack_f5c = auVar8._12_4_;
          auVar86._0_4_ = local_f68 * 2.0;
          auVar86._4_4_ = fStack_f64 * 2.0;
          auVar86._8_4_ = fStack_f60 * 2.0;
          auVar86._12_4_ = fStack_f5c * 2.0;
          auVar51._8_8_ = 0x3f8000003f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar8 = vsubps_avx(auVar86,auVar51);
          local_1cd8 = auVar8._0_4_;
          fStack_1cd4 = auVar8._4_4_;
          fStack_1cd0 = auVar8._8_4_;
          fStack_1ccc = auVar8._12_4_;
          local_20e8._4_4_ = fStack_1c24 * fStack_1cd4;
          local_20e8._0_4_ = local_1c28 * local_1cd8;
          uStack_20e0._0_4_ = fStack_1cc0 * fStack_1cd0;
          uStack_20e0._4_4_ = fStack_1cbc * fStack_1ccc;
          break;
        case 6:
          fVar82 = *(float *)*in_stack_00000030;
          fVar83 = *(float *)(*in_stack_00000030 + 4);
          local_1c88 = CONCAT44(fStack_1c24 * fVar82 + fVar83,local_1c28 * fVar82 + fVar83);
          uStack_1c80._0_4_ = fStack_1cc0 * fVar82 + fVar83;
          uStack_1c80._4_4_ = fStack_1cbc * fVar82 + fVar83;
          auVar8._8_8_ = uStack_1c80;
          auVar8._0_8_ = local_1c88;
          auVar8 = vmaxps_avx(auVar8,ZEXT816(0));
          auVar6._8_8_ = 0x3f8000003f800000;
          auVar6._0_8_ = 0x3f8000003f800000;
          auVar8 = vminps_avx(auVar8,auVar6);
          local_1c18 = auVar8._0_4_;
          fStack_1c14 = auVar8._4_4_;
          fStack_1c10 = auVar8._8_4_;
          fStack_1c0c = auVar8._12_4_;
          local_20e8._4_4_ = fStack_1c14 * fStack_1c24;
          local_20e8._0_4_ = local_1c18 * local_1c28;
          uStack_20e0._0_4_ = fStack_1c10 * fStack_1cc0;
          uStack_20e0._4_4_ = fStack_1c0c * fStack_1cbc;
          break;
        default:
          uStack_20e0 = uStack_2580;
          local_20e8 = (undefined1  [8])local_2588;
        }
        *local_2500 = local_20e8;
        local_2500[1] = uStack_20e0;
        local_2500 = local_2500 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 4;

                            int k = (y * kernel_w + x) * 16;

                            __m128 _val0 = _mm_load1_ps(sptr);
                            __m128 _val1 = _mm_load1_ps(sptr + 1);
                            __m128 _val2 = _mm_load1_ps(sptr + 2);
                            __m128 _val3 = _mm_load1_ps(sptr + 3);
                            __m128 _w0 = _mm_load_ps(kptr + k);
                            __m128 _w1 = _mm_load_ps(kptr + k + 4);
                            __m128 _w2 = _mm_load_ps(kptr + k + 8);
                            __m128 _w3 = _mm_load_ps(kptr + k + 12);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                        }
                    }

                    kptr += maxk * 16;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}